

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_digit.c
# Opt level: O0

void convert_digit_pron(char **list,NJDNode *node)

{
  int iVar1;
  char *__s1;
  NJDNode *in_RSI;
  long in_RDI;
  char *str;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  NJDNode *in_stack_ffffffffffffffd0;
  int local_14;
  
  __s1 = NJDNode_get_string(in_RSI);
  iVar1 = strcmp(__s1,"*");
  if (iVar1 != 0) {
    local_14 = 0;
    while (*(long *)(in_RDI + (long)local_14 * 8) != 0) {
      iVar1 = strcmp(*(char **)(in_RDI + (long)local_14 * 8),__s1);
      if (iVar1 == 0) {
        NJDNode_set_pron(in_stack_ffffffffffffffd0,
                         (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        atoi(*(char **)(in_RDI + (long)(local_14 + 2) * 8));
        NJDNode_set_acc(in_RSI,in_stack_ffffffffffffffcc);
        atoi(*(char **)(in_RDI + (long)(local_14 + 3) * 8));
        NJDNode_set_mora_size(in_RSI,in_stack_ffffffffffffffcc);
        return;
      }
      local_14 = local_14 + 4;
    }
  }
  return;
}

Assistant:

static void convert_digit_pron(const char *list[], NJDNode * node)
{
   int i;
   const char *str = NJDNode_get_string(node);

   if (strcmp(str, "*") == 0)
      return;
   for (i = 0; list[i] != NULL; i += 4) {
      if (strcmp(list[i], str) == 0) {
         NJDNode_set_pron(node, (char *) list[i + 1]);
         NJDNode_set_acc(node, atoi(list[i + 2]));
         NJDNode_set_mora_size(node, atoi(list[i + 3]));
         return;
      }
   }
}